

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseEAMArray
          (EAMAtomTypesSectionParser *this,istream *input,
          vector<double,_std::allocator<double>_> *array,int num)

{
  iterator __position;
  int iVar1;
  long *plVar2;
  size_t sVar3;
  int iVar4;
  StringTokenizer tokenizer;
  char buffer [65535];
  string sStack_100d8;
  string sStack_100b8;
  ulong uStack_10098;
  StringTokenizer SStack_10090;
  char acStack_10038 [65544];
  
  if (4 < num) {
    uStack_10098 = (ulong)(uint)(num / 5);
    iVar4 = 0;
    do {
      std::ios::widen((char)input->_vptr_basic_istream[-3] + (char)input);
      plVar2 = (long *)std::istream::getline((char *)input,(long)acStack_10038,-1);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
        builtin_strncpy(painCave.errMsg + 0x30,"s to read\n",0xb);
        builtin_strncpy(painCave.errMsg + 0x20," Not enough line",0x10);
        builtin_strncpy(painCave.errMsg + 0x10,"ionParser Error:",0x10);
        builtin_strncpy(painCave.errMsg,"EAMAtomTypesSect",0x10);
        painCave.isFatal = 1;
        simError();
        return;
      }
      sStack_100d8._M_dataplus._M_p = (pointer)&sStack_100d8.field_2;
      sVar3 = strlen(acStack_10038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sStack_100d8,acStack_10038,acStack_10038 + sVar3);
      sStack_100b8._M_dataplus._M_p = (pointer)&sStack_100b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_100b8," ;\t\n\r","");
      StringTokenizer::StringTokenizer(&SStack_10090,&sStack_100d8,&sStack_100b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_100b8._M_dataplus._M_p != &sStack_100b8.field_2) {
        operator_delete(sStack_100b8._M_dataplus._M_p,sStack_100b8.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_100d8._M_dataplus._M_p != &sStack_100d8.field_2) {
        operator_delete(sStack_100d8._M_dataplus._M_p,sStack_100d8.field_2._M_allocated_capacity + 1
                       );
      }
      iVar1 = StringTokenizer::countTokens(&SStack_10090);
      if (iVar1 < 5) {
        builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",0x34)
        ;
        painCave.isFatal = 1;
        simError();
      }
      else {
        iVar1 = 5;
        do {
          sStack_100d8._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&SStack_10090)
          ;
          __position._M_current =
               (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (array,__position,(double *)&sStack_100d8);
          }
          else {
            *__position._M_current = (double)sStack_100d8._M_dataplus._M_p;
            (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10090.delim_._M_dataplus._M_p != &SStack_10090.delim_.field_2) {
        operator_delete(SStack_10090.delim_._M_dataplus._M_p,
                        SStack_10090.delim_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SStack_10090.tokenString_._M_dataplus._M_p != &SStack_10090.tokenString_.field_2) {
        operator_delete(SStack_10090.tokenString_._M_dataplus._M_p,
                        SStack_10090.tokenString_.field_2._M_allocated_capacity + 1);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != (int)uStack_10098);
  }
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseEAMArray(istream& input,
                                                std::vector<RealType>& array,
                                                int num) {
    const int dataPerLine = 5;
    if (num % dataPerLine != 0) {}

    int nlinesToRead = num / dataPerLine;

    const int bufferSize = 65535;
    char buffer[bufferSize];
    int lineCount = 0;

    while (lineCount < nlinesToRead && input.getline(buffer, bufferSize)) {
      StringTokenizer tokenizer(buffer);
      if (tokenizer.countTokens() >= dataPerLine) {
        for (int i = 0; i < dataPerLine; ++i) {
          array.push_back(tokenizer.nextTokenAsDouble());
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
      ++lineCount;
    }

    if (lineCount < nlinesToRead) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAtomTypesSectionParser Error: "
               "Not enough lines to read\n");
      painCave.isFatal = 1;
      simError();
    }
  }